

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O3

bool __thiscall
gepard::SegmentApproximator::curveIsLineSegment(SegmentApproximator *this,FloatPoint *points)

{
  FloatPoint FVar1;
  FloatPoint FVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined4 in_EAX;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  
  FVar1 = *points;
  dVar3 = points[1].x;
  dVar4 = points[1].y;
  FVar2 = points[3];
  dVar8 = FVar1.x;
  dVar12 = FVar2.x - dVar8;
  dVar10 = FVar1.y;
  dVar13 = FVar2.y - dVar10;
  dVar9 = this->kTolerance;
  if (ABS((dVar10 - dVar4) * dVar12 - (dVar8 - dVar3) * dVar13) <= dVar9) {
    dVar5 = points[2].x;
    dVar6 = points[2].y;
    if (ABS((dVar10 - dVar6) * dVar12 - (dVar8 - dVar5) * dVar13) <= dVar9) {
      auVar11 = minpd((undefined1  [16])FVar1,(undefined1  [16])FVar2);
      dVar10 = auVar11._0_8_ - dVar9;
      dVar12 = auVar11._8_8_ - dVar9;
      auVar11 = maxpd((undefined1  [16])FVar2,(undefined1  [16])FVar1);
      dVar8 = auVar11._0_8_ + dVar9;
      dVar9 = auVar11._8_8_ + dVar9;
      auVar11._0_4_ = -(uint)(dVar3 <= dVar8 && dVar10 <= dVar3);
      auVar11._4_4_ = -(uint)(dVar4 <= dVar9 && dVar12 <= dVar4);
      auVar11._8_4_ = -(uint)(dVar5 <= dVar8 && dVar10 <= dVar5);
      auVar11._12_4_ = -(uint)(dVar6 <= dVar9 && dVar12 <= dVar6);
      iVar7 = movmskps(in_EAX,auVar11);
      return iVar7 == 0xf;
    }
  }
  return false;
}

Assistant:

const bool SegmentApproximator::curveIsLineSegment(FloatPoint points[])
{
    const Float x0 = points[0].x;
    const Float y0 = points[0].y;
    const Float x1 = points[1].x;
    const Float y1 = points[1].y;
    const Float x2 = points[2].x;
    const Float y2 = points[2].y;
    const Float x3 = points[3].x;
    const Float y3 = points[3].y;

    const Float dt1 = std::fabs((x3 - x0) * (y0 - y1) - (x0 - x1) * (y3 - y0));
    const Float dt2 = std::fabs((x3 - x0) * (y0 - y2) - (x0 - x2) * (y3 - y0));

    if (dt1 > kTolerance || dt2 > kTolerance)
        return false;

    Float minX, minY, maxX, maxY;

    if (x0 < x3) {
        minX = x0 - kTolerance;
        maxX = x3 + kTolerance;
    } else {
        minX = x3 - kTolerance;
        maxX = x0 + kTolerance;
    }

    if (y0 < y3) {
        minY = y0 - kTolerance;
        maxY = y3 + kTolerance;
    } else {
        minY = y3 - kTolerance;
        maxY = y0 + kTolerance;
    }

    return !(x1 < minX || x1 > maxX || y1 < minY || y1 > maxY
             || x2 < minX || x2 > maxX || y2 < minY || y2 > maxY);
}